

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommonCore.cpp
# Opt level: O1

void __thiscall helics::CommonCore::processCommandsForCore(CommonCore *this,ActionMessage *cmd)

{
  bool bVar1;
  action_t aVar2;
  GlobalFederateId federateID;
  BaseTimeCoordinator *pBVar3;
  pointer pcVar4;
  size_type sVar5;
  string_view message;
  string_view message_00;
  FederateStates FVar6;
  uint uVar7;
  int iVar8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar9;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar10;
  ActionMessage *in_RDX;
  long lVar11;
  uint uVar12;
  FedInfo **ppFVar13;
  ulong uVar14;
  FedInfo *pFVar15;
  FedInfo **ppFVar16;
  FedInfo **ppFVar17;
  string_view name;
  string_view name_00;
  string debugString;
  json json;
  undefined1 local_1a0 [184];
  undefined1 local_e8 [184];
  
  aVar2 = cmd->messageAction;
  if (aVar2 < cmd_add_dependency) {
    uVar7 = aVar2 + cmd_disconnect;
    if (0x2c < uVar7) {
LAB_002c3e4b:
      federateID.gid = (this->super_BrokerBase).global_broker_id_local.gid;
      pcVar4 = (this->super_BrokerBase).identifier._M_dataplus._M_p;
      sVar5 = (this->super_BrokerBase).identifier._M_string_length;
      prettyPrintString_abi_cxx11_((string *)local_e8,(helics *)cmd,in_RDX);
      pbVar9 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
               ::replace((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_e8,0,0,"dropping message:",0x11);
      local_1a0._0_8_ = (pbVar9->_M_dataplus)._M_p;
      paVar10 = &pbVar9->field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1a0._0_8_ == paVar10) {
        local_1a0._16_8_ = paVar10->_M_allocated_capacity;
        local_1a0._24_8_ = *(undefined8 *)((long)&pbVar9->field_2 + 8);
        local_1a0._0_8_ = local_1a0 + 0x10;
      }
      else {
        local_1a0._16_8_ = paVar10->_M_allocated_capacity;
      }
      local_1a0._8_8_ = pbVar9->_M_string_length;
      (pbVar9->_M_dataplus)._M_p = (pointer)paVar10;
      pbVar9->_M_string_length = 0;
      (pbVar9->field_2)._M_local_buf[0] = '\0';
      message_00._M_str = (char *)local_1a0._0_8_;
      message_00._M_len = local_1a0._8_8_;
      name_00._M_str = pcVar4;
      name_00._M_len = sVar5;
      BrokerBase::sendToLogger(&this->super_BrokerBase,federateID,3,name_00,message_00,false);
      if ((undefined1 *)local_1a0._0_8_ != local_1a0 + 0x10) {
        operator_delete((void *)local_1a0._0_8_,local_1a0._16_8_ + 1);
      }
      if ((undefined1 *)CONCAT71(local_e8._1_7_,local_e8[0]) == local_e8 + 0x10) {
        return;
      }
      operator_delete((undefined1 *)CONCAT71(local_e8._1_7_,local_e8[0]),
                      (ulong)(local_e8._16_8_ + 1));
      return;
    }
    if ((0x4402801e41U >> ((ulong)uVar7 & 0x3f) & 1) == 0) {
      if ((0x180000000000U >> ((ulong)uVar7 & 0x3f) & 1) != 0) {
        manageTimeBlocks(this,cmd);
        return;
      }
      goto LAB_002c3e4b;
    }
  }
  else if (aVar2 < cmd_grant_timeout_check) {
    if (((uint)(aVar2 + ~(cmd_remove_publication|cmd_disconnect)) < 10) &&
       (in_RDX = (ActionMessage *)0x333,
       (0x333U >> (aVar2 + ~(cmd_remove_publication|cmd_disconnect) & 0x1fU) & 1) != 0)) {
      BaseTimeCoordinator::processDependencyUpdateMessage
                ((this->super_BrokerBase).timeCoord._M_t.
                 super___uniq_ptr_impl<helics::BaseTimeCoordinator,_std::default_delete<helics::BaseTimeCoordinator>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_helics::BaseTimeCoordinator_*,_std::default_delete<helics::BaseTimeCoordinator>_>
                 .super__Head_base<0UL,_helics::BaseTimeCoordinator_*,_false>._M_head_impl,cmd);
      return;
    }
    if (aVar2 != cmd_timing_info) goto LAB_002c3e4b;
  }
  else if ((5 < (uint)(aVar2 + 0xffffd8f0)) ||
          (in_RDX = (ActionMessage *)0x29, (0x29U >> (aVar2 + 0xffffd8f0 & 0x1fU) & 1) == 0)) {
    if (aVar2 == cmd_grant_timeout_check) {
      BaseTimeCoordinator::grantTimeoutCheck_abi_cxx11_
                ((BaseTimeCoordinator *)local_e8,
                 (ActionMessage *)
                 (this->super_BrokerBase).timeCoord._M_t.
                 super___uniq_ptr_impl<helics::BaseTimeCoordinator,_std::default_delete<helics::BaseTimeCoordinator>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_helics::BaseTimeCoordinator_*,_std::default_delete<helics::BaseTimeCoordinator>_>
                 .super__Head_base<0UL,_helics::BaseTimeCoordinator_*,_false>._M_head_impl);
      if (local_e8[0] != null) {
        fileops::generateJsonString((string *)local_1a0,(json *)local_e8,true);
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::insert
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1a0,0,
                   "TIME DEBUGGING::");
        message._M_str = (char *)local_1a0._0_8_;
        message._M_len = local_1a0._8_8_;
        name._M_str = (this->super_BrokerBase).identifier._M_dataplus._M_p;
        name._M_len = (this->super_BrokerBase).identifier._M_string_length;
        BrokerBase::sendToLogger
                  (&this->super_BrokerBase,
                   (GlobalFederateId)(this->super_BrokerBase).global_broker_id_local.gid,3,name,
                   message,false);
        if ((undefined1 *)local_1a0._0_8_ != local_1a0 + 0x10) {
          operator_delete((void *)local_1a0._0_8_,local_1a0._16_8_ + 1);
        }
      }
      nlohmann::json_abi_v3_11_3::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
      ::data::~data((data *)local_e8);
      return;
    }
    if (aVar2 != cmd_time_request) goto LAB_002c3e4b;
  }
  pBVar3 = (this->super_BrokerBase).timeCoord._M_t.
           super___uniq_ptr_impl<helics::BaseTimeCoordinator,_std::default_delete<helics::BaseTimeCoordinator>_>
           ._M_t.
           super__Tuple_impl<0UL,_helics::BaseTimeCoordinator_*,_std::default_delete<helics::BaseTimeCoordinator>_>
           .super__Head_base<0UL,_helics::BaseTimeCoordinator_*,_false>._M_head_impl;
  bVar1 = (this->super_BrokerBase).enteredExecutionMode;
  iVar8 = (*pBVar3->_vptr_BaseTimeCoordinator[3])(pBVar3,cmd);
  if (bVar1 == false) {
    pBVar3 = (this->super_BrokerBase).timeCoord._M_t.
             super___uniq_ptr_impl<helics::BaseTimeCoordinator,_std::default_delete<helics::BaseTimeCoordinator>_>
             ._M_t.
             super__Tuple_impl<0UL,_helics::BaseTimeCoordinator_*,_std::default_delete<helics::BaseTimeCoordinator>_>
             .super__Head_base<0UL,_helics::BaseTimeCoordinator_*,_false>._M_head_impl;
    iVar8 = (*pBVar3->_vptr_BaseTimeCoordinator[9])(pBVar3,0x8831d580);
    if ((char)iVar8 == '\0') {
      (this->super_BrokerBase).enteredExecutionMode = true;
    }
  }
  else if ((char)iVar8 != '\0') {
    (*((this->super_BrokerBase).timeCoord._M_t.
       super___uniq_ptr_impl<helics::BaseTimeCoordinator,_std::default_delete<helics::BaseTimeCoordinator>_>
       ._M_t.
       super__Tuple_impl<0UL,_helics::BaseTimeCoordinator_*,_std::default_delete<helics::BaseTimeCoordinator>_>
       .super__Head_base<0UL,_helics::BaseTimeCoordinator_*,_false>._M_head_impl)->
      _vptr_BaseTimeCoordinator[2])();
  }
  aVar2 = cmd->messageAction;
  if (cmd_remove_subscriber < aVar2) {
    if ((((3 < (uint)(aVar2 + 0xfffffc12)) || (aVar2 + 0xfffffc12 == 1)) &&
        (aVar2 != cmd_remove_filter)) && (aVar2 != cmd_remove_endpoint)) {
      return;
    }
LAB_002c3d77:
    checkAndProcessDisconnect(this);
    return;
  }
  uVar14 = (ulong)(uint)(aVar2 + cmd_disconnect);
  if (0x26 < (uint)(aVar2 + cmd_disconnect)) {
    return;
  }
  if ((0x600001fa1U >> (uVar14 & 0x3f) & 1) != 0) goto LAB_002c3d77;
  if (uVar14 != 6) {
    if (uVar14 != 0x26) {
      return;
    }
    if ((cmd->actionTime).internalTimeCode != 0x7fffffffffffffff) {
      return;
    }
    if (aVar2 != cmd_disconnect) goto LAB_002c3d77;
  }
  if ((cmd->source_id).gid != (this->super_BrokerBase).higher_broker_id.gid) goto LAB_002c3d77;
  BrokerBase::setBrokerState(&this->super_BrokerBase,TERMINATING);
  if (((this->super_BrokerBase).hasTimeDependency != false) ||
     ((this->super_BrokerBase).hasFilters == true)) {
    BaseTimeCoordinator::disconnect
              ((this->super_BrokerBase).timeCoord._M_t.
               super___uniq_ptr_impl<helics::BaseTimeCoordinator,_std::default_delete<helics::BaseTimeCoordinator>_>
               ._M_t.
               super__Tuple_impl<0UL,_helics::BaseTimeCoordinator_*,_std::default_delete<helics::BaseTimeCoordinator>_>
               .super__Head_base<0UL,_helics::BaseTimeCoordinator_*,_false>._M_head_impl);
  }
  ActionMessage::ActionMessage((ActionMessage *)local_1a0,cmd_disconnect_fed_ack);
  local_1a0._8_8_ = (ulong)(uint)local_1a0._12_4_ << 0x20;
  if ((this->loopFederates).dataStorage.csize == 0) {
    uVar14 = (ulong)(this->loopFederates).dataStorage.bsize;
    ppFVar17 = (this->loopFederates).dataStorage.dataptr;
    if (uVar14 != 0x20) {
      ppFVar17 = ppFVar17 + (this->loopFederates).dataStorage.dataSlotIndex;
      pFVar15 = *ppFVar17 + uVar14;
      goto LAB_002c3d2c;
    }
    if (ppFVar17 == (FedInfo **)0x0) {
      ppFVar17 = &gmlc::containers::
                  StableBlockVector<helics::FedInfo,_5U,_std::allocator<helics::FedInfo>_>::end::
                  emptyValue;
    }
    else {
      ppFVar17 = ppFVar17 + (long)(this->loopFederates).dataStorage.dataSlotIndex + 1;
    }
  }
  else {
    ppFVar17 = (this->loopFederates).dataStorage.dataptr;
  }
  pFVar15 = *ppFVar17;
  uVar14 = 0;
LAB_002c3d2c:
  uVar7 = (this->loopFederates).dataStorage.bsize;
  ppFVar16 = (this->loopFederates).dataStorage.dataptr;
  lVar11 = (long)(this->loopFederates).dataStorage.dataSlotIndex;
  if (ppFVar16 == (FedInfo **)0x0) {
    ppFVar13 = &gmlc::containers::
                StableBlockVector<helics::FedInfo,_5U,_std::allocator<helics::FedInfo>_>::end::
                emptyValue;
  }
  else {
    ppFVar13 = ppFVar16 + lVar11 + 1;
  }
  uVar12 = 0;
  if (uVar7 != 0x20) {
    uVar12 = uVar7;
  }
  ppFVar16 = ppFVar16 + lVar11;
  if (uVar7 == 0x20) {
    ppFVar16 = ppFVar13;
  }
  if (((uint)uVar14 != uVar12) || (ppFVar17 != ppFVar16)) {
    do {
      FVar6 = FederateState::getState(pFVar15->fed);
      if ((FVar6 & ~INITIALIZING) != ERRORED) {
        local_1a0._16_4_ = (pFVar15->fed->global_id)._M_i.gid;
        FederateState::addAction(pFVar15->fed,(ActionMessage *)local_1a0);
      }
      iVar8 = (int)uVar14;
      uVar7 = iVar8 + 1;
      if (iVar8 < 0x1f) {
        pFVar15 = pFVar15 + 1;
      }
      else {
        ppFVar17 = ppFVar17 + (ulong)(iVar8 - 0x1fU >> 5) + 1;
        uVar7 = uVar7 & 0x1f;
        pFVar15 = (FedInfo *)((long)&(*ppFVar17)->fed + (ulong)(uVar7 << 4));
      }
      uVar14 = (ulong)uVar7;
    } while ((uVar7 != uVar12) || (ppFVar17 != ppFVar16));
  }
  ActionMessage::ActionMessage((ActionMessage *)local_e8,cmd_stop);
  BrokerBase::addActionMessage(&this->super_BrokerBase,(ActionMessage *)local_e8);
  ActionMessage::~ActionMessage((ActionMessage *)local_e8);
  ActionMessage::~ActionMessage((ActionMessage *)local_1a0);
  return;
}

Assistant:

void CommonCore::processCommandsForCore(const ActionMessage& cmd)
{
    if (isTimingCommand(cmd)) {
        if (!enteredExecutionMode) {
            timeCoord->processTimeMessage(cmd);
            auto res = timeCoord->checkExecEntry();
            if (res == MessageProcessingResult::NEXT_STEP) {
                enteredExecutionMode = true;
            }
        } else {
            if (timeCoord->processTimeMessage(cmd) != TimeProcessingResult::NOT_PROCESSED) {
                timeCoord->updateTimeFactors();
            }
        }
        if (isDisconnectCommand(cmd)) {
            if ((cmd.action() == CMD_DISCONNECT) && (cmd.source_id == higher_broker_id)) {
                setBrokerState(BrokerState::TERMINATING);
                if (hasTimeDependency || hasFilters) {
                    timeCoord->disconnect();
                }
                ActionMessage bye(CMD_DISCONNECT_FED_ACK);
                bye.source_id = parent_broker_id;
                loopFederates.apply([&bye](auto& fed) {
                    auto state = fed->getState();
                    if ((FederateStates::FINISHED == state) || (FederateStates::ERRORED == state)) {
                        return;
                    }
                    bye.dest_id = fed->global_id.load();
                    fed->addAction(bye);
                });

                addActionMessage(CMD_STOP);
            } else {
                checkAndProcessDisconnect();
            }
        }
    } else if (isDependencyCommand(cmd)) {
        timeCoord->processDependencyUpdateMessage(cmd);
    } else if (cmd.action() == CMD_TIME_BLOCK || cmd.action() == CMD_TIME_UNBLOCK) {
        manageTimeBlocks(cmd);
    } else if (cmd.action() == CMD_GRANT_TIMEOUT_CHECK) {
        auto json = timeCoord->grantTimeoutCheck(cmd);
        if (!json.is_null()) {
            auto debugString = fileops::generateJsonString(json);
            debugString.insert(0, "TIME DEBUGGING::");
            LOG_WARNING(global_broker_id_local, getIdentifier(), debugString);
        }
    } else {
        LOG_WARNING(global_broker_id_local,
                    getIdentifier(),
                    "dropping message:" + prettyPrintString(cmd));
    }
}